

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.c
# Opt level: O0

_Bool upb_strtable_next2(upb_strtable *t,upb_StringView *key,upb_value *val,intptr_t *iter)

{
  size_t sVar1;
  size_t sVar2;
  upb_tabent *puVar3;
  upb_StringView uVar4;
  char *local_50;
  size_t local_48;
  upb_tabent *ent;
  size_t tab_idx;
  intptr_t *iter_local;
  upb_value *val_local;
  upb_StringView *key_local;
  upb_strtable *t_local;
  
  sVar1 = next(&t->t,*iter);
  sVar2 = upb_table_size(&t->t);
  if (sVar1 < sVar2) {
    puVar3 = (t->t).entries + sVar1;
    uVar4 = upb_key_strview(puVar3->key);
    local_50 = uVar4.data;
    key->data = local_50;
    local_48 = uVar4.size;
    key->size = local_48;
    val->val = (puVar3->val).val;
    *iter = sVar1;
  }
  return sVar1 < sVar2;
}

Assistant:

bool upb_strtable_next2(const upb_strtable* t, upb_StringView* key,
                        upb_value* val, intptr_t* iter) {
  size_t tab_idx = next(&t->t, *iter);
  if (tab_idx < upb_table_size(&t->t)) {
    upb_tabent* ent = &t->t.entries[tab_idx];
    *key = upb_key_strview(ent->key);
    *val = ent->val;
    *iter = tab_idx;
    return true;
  }

  return false;
}